

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::Prim::set_primdata<tinyusdz::Model>(Prim *this,string *elementName,Model *prim)

{
  Model *p;
  allocator local_111;
  string local_110;
  Path local_f0;
  Model *local_20;
  Model *prim_local;
  string *elementName_local;
  Prim *this_local;
  
  local_20 = prim;
  prim_local = (Model *)elementName;
  elementName_local = (string *)this;
  tinyusdz::value::Value::operator=(&this->_data,prim);
  SetPrimElementName(&this->_data,(string *)prim_local);
  p = prim_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"",&local_111);
  Path::Path(&local_f0,(string *)p,&local_110);
  Path::operator=(&this->_elementPath,&local_f0);
  Path::~Path(&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  return;
}

Assistant:

void set_primdata(const std::string &elementName, const T &prim) {
    // Check if T is Prim class type.
    static_assert((value::TypeId::TYPE_ID_MODEL_BEGIN <=
                   value::TypeTraits<T>::type_id()) &&
                      (value::TypeId::TYPE_ID_MODEL_END >
                       value::TypeTraits<T>::type_id()),
                  "T is not a Prim class type");
    _data = prim;
    SetPrimElementName(_data, elementName);
    _elementPath = Path(elementName, "");
  }